

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_timeouts_test.cpp
# Opt level: O0

void __thiscall sync_test::main(sync_test *this,string *param_2)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  time_t tVar4;
  ostream *poVar5;
  ulong uVar6;
  time_t tVar7;
  char *in_RDI;
  int timeout;
  time_t end;
  uint i;
  time_t start;
  ostream *out;
  bool bad_found;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint local_2c;
  
  bVar1 = false;
  cppcms::application::response();
  pvVar3 = (void *)cppcms::http::response::out();
  tVar4 = time((time_t *)0x0);
  local_2c = 0;
  do {
    if (9999999 < local_2c) {
LAB_0010f9a4:
      tVar7 = time((time_t *)0x0);
      cppcms::application::settings();
      iVar2 = cppcms::json::value::get<int>
                        ((value *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         in_RDI);
      poVar5 = std::operator<<((ostream *)&std::cout,"IO Completed in ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,tVar7 - tVar4);
      poVar5 = std::operator<<(poVar5," seconds, timeout=");
      pvVar3 = (void *)std::ostream::operator<<(poVar5,iVar2);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      if ((long)(iVar2 * 3) < tVar7 - tVar4) {
        above_3to = above_3to + 1;
      }
      else if (tVar7 - tVar4 < (long)(iVar2 << 1)) {
        below_2to = below_2to + 1;
      }
      if (bVar1) {
        poVar5 = std::operator<<((ostream *)&std::cout,"Disconned as expected");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        sync_bad_count = sync_bad_count + 1;
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,"Not disconnected!");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      return;
    }
    poVar5 = (ostream *)std::ostream::operator<<(pvVar3,local_2c);
    poVar5 = std::operator<<(poVar5,'\n');
    uVar6 = std::ios::operator!((ios *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18)));
    if ((uVar6 & 1) != 0) {
      bVar1 = true;
      goto LAB_0010f9a4;
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

virtual void main(std::string /*unused*/)
	{
		bool bad_found = false;
		std::ostream &out = response().out();
		time_t start = time(0);
		for(unsigned i=0;i<10000000;i++) {
			if(!(out << i << '\n')) {
				bad_found = true;
				break;
			}
		}
		time_t end = time(0);
		int timeout = settings().get<int>("http.timeout");
		std::cout << "IO Completed in " << (end-start) << " seconds, timeout=" << timeout << std::endl;
		if(end - start > 3*timeout)
			above_3to ++;
		else if(end - start < 2*timeout)
			below_2to ++;

		if(bad_found) {
			std::cout << "Disconned as expected" << std::endl;
			sync_bad_count++;
		}
		else {
			std::cout << "Not disconnected!" << std::endl;
		}
	}